

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

pair<bool,_Point> intersection(Segment *segment,Triangle *triangle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pair<bool,_Point> pVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint local_30;
  undefined8 uStack_2c;
  
  uVar1 = (segment->b).x;
  uVar5 = (segment->b).y;
  fVar21 = (float)uVar5 - (segment->a).y;
  fVar18 = (segment->b).z - (segment->a).z;
  fVar17 = (float)uVar1 - (segment->a).x;
  fVar10 = fVar18 * fVar18 + fVar17 * fVar17 + fVar21 * fVar21;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar17 = fVar17 / fVar10;
  fVar21 = fVar21 / fVar10;
  fVar18 = fVar18 / fVar10;
  uVar2 = (triangle->y).x;
  uVar6 = (triangle->y).y;
  fVar10 = (triangle->x).x;
  fVar19 = (triangle->x).y;
  fVar14 = (float)uVar2 - fVar10;
  fVar13 = (float)uVar6 - fVar19;
  fVar23 = (triangle->x).z;
  fVar16 = (triangle->y).z - fVar23;
  uVar3 = (triangle->z).x;
  uVar7 = (triangle->z).y;
  fVar11 = (float)uVar3 - fVar10;
  fVar12 = (float)uVar7 - fVar19;
  fVar22 = (triangle->z).z - fVar23;
  fVar25 = fVar21 * fVar22 - fVar18 * fVar12;
  fVar26 = fVar18 * fVar11 - fVar22 * fVar17;
  fVar20 = fVar17 * fVar12 - fVar11 * fVar21;
  fVar15 = fVar16 * fVar20 + fVar14 * fVar25 + fVar13 * fVar26;
  if (1.1920929e-07 <= ABS(fVar15)) {
    fVar15 = 1.0 / fVar15;
    uVar4 = (segment->a).x;
    uVar8 = (segment->a).y;
    fVar24 = (segment->a).z;
    fVar10 = (float)uVar4 - fVar10;
    fVar19 = (float)uVar8 - fVar19;
    fVar23 = fVar24 - fVar23;
    fVar20 = (fVar20 * fVar23 + fVar25 * fVar10 + fVar26 * fVar19) * fVar15;
    if ((0.0 <= fVar20) && (fVar20 <= 1.0)) {
      fVar25 = fVar19 * fVar16 - fVar23 * fVar13;
      fVar23 = fVar23 * fVar14 - fVar16 * fVar10;
      fVar19 = fVar10 * fVar13 - fVar14 * fVar19;
      fVar10 = (fVar18 * fVar19 + fVar17 * fVar25 + fVar21 * fVar23) * fVar15;
      if ((0.0 <= fVar10) &&
         ((fVar20 + fVar10 <= 1.0 &&
          (fVar15 = fVar15 * (fVar22 * fVar19 + fVar11 * fVar25 + fVar12 * fVar23), 0.0 < fVar15))))
      {
        fVar24 = fVar24 + fVar18 * fVar15;
        local_30 = CONCAT31(local_30._1_3_,1);
        uStack_2c = CONCAT44(fVar21 * fVar15 + (float)uVar8,fVar17 * fVar15 + (float)uVar4);
        goto LAB_001085ee;
      }
    }
    fVar24 = 0.0;
    local_30 = (uint)local_30._1_3_ << 8;
    uStack_2c = 0;
  }
  else {
    local_30 = local_30 & 0xffffff00;
    uStack_2c = 0;
    fVar24 = 0.0;
  }
LAB_001085ee:
  pVar9.second.x = (float)(undefined4)uStack_2c;
  pVar9.second.y = (float)uStack_2c._4_4_;
  pVar9._0_4_ = local_30;
  pVar9.second.z = fVar24;
  return pVar9;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Triangle const& triangle)
{
  Vector const D = normalize(segment.b - segment.a);

  Vector e1 = triangle.y - triangle.x;
  Vector e2 = triangle.z - triangle.x;

  Vector P = crossProduct(D, e2);
  float det = dotProduct(e1, P);

  if (isCloseToZero(det))
    return {false, {}};

  float inv_det = 1.f / det;
  Vector T = segment.a - triangle.x;
  float u = dotProduct(T, P) * inv_det;
  if (u < 0.f || u > 1.f)
    return {false, {}};

  Vector Q = crossProduct(T, e1);
  float v = dotProduct(D, Q) * inv_det;

  if (v < 0.f || u + v > 1.f)
    return {false, {}};

  float t = dotProduct(e2, Q) * inv_det;
  if (t > 0)
  {
    Point res = segment.a + D * t;
    return {true, res};
  }

  return {false, {}};
}